

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O2

float __thiscall nv::LanczosFilter::evaluate(LanczosFilter *this,float x)

{
  float fVar1;
  float fVar2;
  
  fVar1 = 0.0;
  if (ABS(x) < 3.0) {
    fVar1 = ABS(x) * 3.1415927;
    fVar2 = anon_unknown.dwarf_4c8503::sincf(fVar1);
    fVar1 = anon_unknown.dwarf_4c8503::sincf(fVar1 / 3.0);
    fVar1 = fVar1 * fVar2;
  }
  return fVar1;
}

Assistant:

float LanczosFilter::evaluate(float x) const
{
	x = fabs(x);
	if( x < 3.0f ) return sincf(PI * x) * sincf(PI * x / 3.0f);
	return 0.0f;
}